

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O3

RealType __thiscall
OpenMD::LJ::getSuggestedCutoffRadius(LJ *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  RealType RVar5;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar2 = AtomType::getIdent(atypes.first);
  iVar3 = AtomType::getIdent(atypes.second);
  piVar1 = (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)piVar1[iVar2];
  iVar2 = piVar1[iVar3];
  RVar5 = 0.0;
  if (iVar2 != -1 && lVar4 != -1) {
    RVar5 = *(double *)
             (*(long *)&(this->MixingMap).
                        super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar4].
                        super__Vector_base<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>
                        ._M_impl.super__Vector_impl_data + (long)iVar2 * 0x20) * 2.5;
  }
  return RVar5;
}

Assistant:

RealType LJ::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    int atid1  = atypes.first->getIdent();
    int atid2  = atypes.second->getIdent();
    int ljtid1 = LJtids[atid1];
    int ljtid2 = LJtids[atid2];

    if (ljtid1 == -1 || ljtid2 == -1)
      return 0.0;
    else {
      LJInteractionData mixer = MixingMap[ljtid1][ljtid2];
      return 2.5 * mixer.sigma;
    }
  }